

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::
     InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
               (SnappyDecompressor *decompressor,
               SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *writer,
               uint32_t compressed_len,uint32_t uncompressed_len)

{
  bool bVar1;
  bool bVar2;
  uint in_ECX;
  uint in_EDX;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *in_RSI;
  SnappyDecompressor *in_RDI;
  int token;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *in_stack_00000068;
  SnappyDecompressor *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  uVar3 = 0;
  Report(0,"snappy_uncompress",(ulong)in_EDX,(ulong)in_ECX);
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SetExpectedLength(in_RSI,(ulong)in_ECX)
  ;
  SnappyDecompressor::
  DecompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
            (in_stack_00000070,in_stack_00000068);
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::Flush
            ((SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *)
             CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  bVar1 = SnappyDecompressor::eof(in_RDI);
  bVar2 = false;
  if (bVar1) {
    bVar2 = SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::CheckLength
                      ((SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *)
                       (CONCAT44(uVar3,in_stack_ffffffffffffffe0) & 0xffffffff00ffffff));
  }
  return bVar2;
}

Assistant:

static bool InternalUncompressAllTags(SnappyDecompressor* decompressor,
                                      Writer* writer, uint32_t compressed_len,
                                      uint32_t uncompressed_len) {
    int token = 0;
  Report(token, "snappy_uncompress", compressed_len, uncompressed_len);

  writer->SetExpectedLength(uncompressed_len);

  // Process the entire input
  decompressor->DecompressAllTags(writer);
  writer->Flush();
  return (decompressor->eof() && writer->CheckLength());
}